

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImVector<ImGuiDockNodeSettings> *this;
  ImGuiID IVar1;
  char *pcVar2;
  int iVar3;
  ImGuiDockNodeSettings *pIVar4;
  ImGuiDockContextPruneNodeData *pIVar5;
  ImGuiWindowSettings *pIVar6;
  ImGuiDockContextPruneNodeData *pIVar7;
  ImGuiDockNodeSettings *pIVar8;
  int settings_n_1;
  ImChunkStream<ImGuiWindowSettings> *this_00;
  int settings_n;
  int iVar9;
  bool bVar10;
  ImPool<ImGuiDockContextPruneNodeData> local_58;
  
  if ((ctx->Windows).Size == 0) {
    local_58.Map.Data.Size = 0;
    local_58.Map.Data.Capacity = 0;
    local_58.Map.Data.Data = (ImGuiStoragePair *)0x0;
    local_58.Buf.Size = 0;
    local_58.Buf.Capacity = 0;
    local_58.Buf.Data = (ImGuiDockContextPruneNodeData *)0x0;
    local_58.FreeIdx = 0;
    local_58.AliveCount = 0;
    ImPool<ImGuiDockContextPruneNodeData>::Reserve(&local_58,(ctx->DockContext).NodesSettings.Size);
    this = &(ctx->DockContext).NodesSettings;
    for (iVar9 = 0; iVar3 = this->Size, iVar9 < iVar3; iVar9 = iVar9 + 1) {
      pIVar4 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar9);
      if (pIVar4->ParentNodeId == 0) {
        pIVar5 = (ImGuiDockContextPruneNodeData *)0x0;
      }
      else {
        pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar4->ParentNodeId);
      }
      pIVar8 = (ImGuiDockNodeSettings *)&pIVar5->RootId;
      if (pIVar5 == (ImGuiDockContextPruneNodeData *)0x0) {
        pIVar8 = pIVar4;
      }
      IVar1 = pIVar8->ID;
      pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetOrAddByKey(&local_58,pIVar4->ID);
      pIVar5->RootId = IVar1;
      if (pIVar4->ParentNodeId != 0) {
        pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetOrAddByKey
                           (&local_58,pIVar4->ParentNodeId);
        pIVar5->CountChildNodes = pIVar5->CountChildNodes + 1;
      }
    }
    for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
      pIVar4 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar9);
      if ((((pIVar4->ParentWindowId != 0) &&
           (pIVar6 = FindWindowSettings(pIVar4->ParentWindowId),
           pIVar6 != (ImGuiWindowSettings *)0x0)) && (pIVar6->DockId != 0)) &&
         (pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar6->DockId),
         pIVar5 != (ImGuiDockContextPruneNodeData *)0x0)) {
        pIVar5->CountChildNodes = pIVar5->CountChildNodes + 1;
      }
      iVar3 = this->Size;
    }
    pIVar6 = (ImGuiWindowSettings *)(ctx->SettingsWindows).Buf.Data;
    if (pIVar6 != (ImGuiWindowSettings *)0x0) {
      pIVar6 = (ImGuiWindowSettings *)&pIVar6->Pos;
    }
    for (; pIVar6 != (ImGuiWindowSettings *)0x0;
        pIVar6 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar6)) {
      IVar1 = pIVar6->DockId;
      if ((IVar1 != 0) &&
         (pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,IVar1),
         pIVar5 != (ImGuiDockContextPruneNodeData *)0x0)) {
        pIVar5->CountWindows = pIVar5->CountWindows + 1;
        if ((pIVar5->RootId == IVar1) ||
           (pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar5->RootId),
           pIVar5 != (ImGuiDockContextPruneNodeData *)0x0)) {
          pIVar5->CountChildWindows = pIVar5->CountChildWindows + 1;
        }
      }
    }
    for (iVar9 = 0; iVar9 < this->Size; iVar9 = iVar9 + 1) {
      pIVar4 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar9);
      pIVar5 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar4->ID);
      iVar3 = pIVar5->CountWindows;
      if (iVar3 < 2) {
        pIVar7 = pIVar5;
        if (pIVar5->RootId != pIVar4->ID) {
          pIVar7 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar5->RootId);
          iVar3 = pIVar5->CountWindows;
        }
        if (iVar3 == 1 && pIVar4->ParentNodeId == 0) {
          if (pIVar5->CountChildNodes == 0) {
            bVar10 = (pIVar4->Flags & 0x800) == 0;
          }
          else {
LAB_0013c974:
            bVar10 = false;
          }
        }
        else {
          if (iVar3 != 0 || pIVar4->ParentNodeId != 0) goto LAB_0013c974;
          bVar10 = pIVar5->CountChildNodes == 0;
        }
        if ((bVar10) || (pIVar7->CountChildWindows == 0)) {
          pcVar2 = (GImGui->SettingsWindows).Buf.Data;
          this_00 = &GImGui->SettingsWindows;
          pIVar6 = (ImGuiWindowSettings *)(pcVar2 + 4);
          if (pcVar2 == (char *)0x0) {
            pIVar6 = (ImGuiWindowSettings *)0x0;
          }
          for (; pIVar6 != (ImGuiWindowSettings *)0x0;
              pIVar6 = ImChunkStream<ImGuiWindowSettings>::next_chunk(this_00,pIVar6)) {
            if (pIVar6->DockId == pIVar4->ID) {
              pIVar6->DockId = 0;
              pIVar6->DockOrder = -1;
              break;
            }
          }
          pIVar4->ID = 0;
        }
      }
    }
    ImPool<ImGuiDockContextPruneNodeData>::~ImPool(&local_58);
  }
  DockContextBuildNodesFromSettings
            (ctx,(ctx->DockContext).NodesSettings.Data,(ctx->DockContext).NodesSettings.Size);
  DockContextBuildAddWindowsToNodes(ctx,0);
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    // Prune settings at boot time only
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (ctx->Windows.Size == 0)
        DockContextPruneUnusedSettingsNodes(ctx);
    DockContextBuildNodesFromSettings(ctx, dc->NodesSettings.Data, dc->NodesSettings.Size);
    DockContextBuildAddWindowsToNodes(ctx, 0);
}